

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  bigit bVar2;
  int *piVar3;
  ulong uVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bigit rhs_bigit;
  double_bigit sum;
  int i;
  int min_exp;
  double_bigit borrow;
  anon_class_1_0_00000001 get_bigit;
  int num_rhs_bigits;
  int max_lhs_bigits;
  bigint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  bigit in_stack_ffffffffffffffac;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb0;
  int local_48;
  long local_40;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = bigint::num_bigits(in_stack_ffffffffffffffa0);
  local_2c = bigint::num_bigits(in_stack_ffffffffffffffa0);
  piVar3 = std::max<int>(&local_28,&local_2c);
  local_24 = *piVar3;
  local_48 = bigint::num_bigits(in_stack_ffffffffffffffa0);
  if (local_24 + 1 < local_48) {
    local_4 = -1;
  }
  else if (local_48 < local_24) {
    local_4 = 1;
  }
  else {
    local_40 = 0;
    piVar3 = std::min<int>((int *)(local_10 + 0xa8),(int *)(local_18 + 0xa8));
    piVar3 = std::min<int>(piVar3,(int *)(local_20 + 0xa8));
    iVar1 = *piVar3;
    while (local_48 = local_48 + -1, iVar1 <= local_48) {
      bVar2 = add_compare::anon_class_1_0_00000001::operator()
                        (in_stack_ffffffffffffffb0,
                         (bigint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      in_stack_ffffffffffffffa0 = (bigint *)(ulong)bVar2;
      bVar2 = add_compare::anon_class_1_0_00000001::operator()
                        (in_stack_ffffffffffffffb0,
                         (bigint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      in_stack_ffffffffffffffb0 =
           (anon_class_1_0_00000001 *)
           ((long)(in_stack_ffffffffffffffa0->bigits_).store_ + ((ulong)bVar2 - 0x20));
      in_stack_ffffffffffffffac =
           add_compare::anon_class_1_0_00000001::operator()
                     (in_stack_ffffffffffffffb0,
                      (bigint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      if ((anon_class_1_0_00000001 *)((ulong)in_stack_ffffffffffffffac + local_40) <
          in_stack_ffffffffffffffb0) {
        return 1;
      }
      uVar4 = ((ulong)in_stack_ffffffffffffffac + local_40) - (long)in_stack_ffffffffffffffb0;
      if (1 < uVar4) {
        return -1;
      }
      local_40 = uVar4 << 0x20;
    }
    local_4 = 0;
    if (local_40 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int add_compare(const bigint& lhs1, const bigint& lhs2,
                         const bigint& rhs) {
    int max_lhs_bigits = (std::max)(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = (std::min)((std::min)(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }